

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O3

void remove_bad_file(mg_connection *conn,char *path)

{
  int iVar1;
  uint in_ECX;
  char *func;
  
  iVar1 = remove(path);
  if (iVar1 != 0) {
    mg_cry_internal_wrap
              (conn,(mg_context *)0x0,func,in_ECX,"%s: Cannot remove invalid file %s",
               "remove_bad_file",path);
  }
  return;
}

Assistant:

static void
remove_bad_file(const struct mg_connection *conn, const char *path)
{
	int r = mg_remove(conn, path);
	if (r != 0) {
		mg_cry_internal(conn,
		                "%s: Cannot remove invalid file %s",
		                __func__,
		                path);
	}
}